

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<unsigned_int> * __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::getTypeIndex
          (Result<unsigned_int> *__return_storage_ptr__,
          TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this,Name id)

{
  char **reason;
  const_iterator cVar1;
  undefined1 local_78 [8];
  Name id_local;
  Err local_48;
  allocator<char> local_21;
  
  id_local.super_IString.str._M_len = id.super_IString.str._M_str;
  local_78 = id.super_IString.str._M_len;
  cVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->typeIndices->_M_h,(key_type *)local_78);
  if (cVar1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    reason = &id_local.super_IString.str._M_str;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)reason,"unknown type identifier",&local_21);
    Lexer::err(&local_48,(Lexer *)(this + 1),(string *)reason);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&id_local.super_IString.str._M_str);
  }
  else {
    *(undefined4 *)
     &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err> =
         *(undefined4 *)
          ((long)cVar1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>.
                 _M_cur + 0x18);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getTypeIndex(Name id) {
    auto it = typeIndices.find(id);
    if (it == typeIndices.end()) {
      return self().in.err("unknown type identifier");
    }
    return it->second;
  }